

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O2

int __thiscall r_file::open(r_file *this,char *__file,int __oflag,...)

{
  FILE *pFVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pFVar1 = fopen(*(char **)__file,(char *)*___oflag);
  this->_f = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Unable to open: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__file);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

r_file r_file::open(const string& path, const string& mode)
{
    r_file obj;
    obj._f = fopen(path.c_str(), mode.c_str());
    if(!obj._f)
        throw runtime_error("Unable to open: " + path);
    return obj;
}